

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O3

void icu_63::double_conversion::TrimAndCut
               (Vector<const_char> buffer,int exponent,char *buffer_copy_space,int space_size,
               Vector<const_char> *trimmed,int *updated_exponent)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  undefined4 in_register_00000084;
  int i;
  long lVar6;
  char *pcVar7;
  
  pcVar5 = buffer.start_;
  if (0 < buffer.length_) {
    uVar4 = 0;
    do {
      if (pcVar5[uVar4] != '0') {
        pcVar5 = pcVar5 + uVar4;
        uVar1 = buffer.length_ - (int)uVar4;
        goto LAB_00301450;
      }
      uVar4 = uVar4 + 1;
    } while ((buffer._8_8_ & 0xffffffff) != uVar4);
  }
  uVar1 = 0;
LAB_00301450:
  lVar6 = -1;
  iVar3 = 0x30b;
  iVar2 = 0;
  pcVar7 = pcVar5;
  do {
    pcVar7 = pcVar7 + -1;
    if ((int)(uVar1 + iVar2) < 1) {
      iVar2 = uVar1 + exponent;
      uVar4 = 0;
      goto LAB_003014ce;
    }
    lVar6 = lVar6 + 1;
    iVar3 = iVar3 + 1;
    iVar2 = iVar2 + -1;
  } while (pcVar7[uVar1] == '0');
  iVar2 = exponent + (int)lVar6;
  uVar4 = (ulong)uVar1 - lVar6;
  if (uVar4 < 0x30d) {
LAB_003014ce:
    *(char **)CONCAT44(in_register_00000084,space_size) = pcVar5;
    *(int *)(CONCAT44(in_register_00000084,space_size) + 8) = (int)uVar4;
    *(int *)&trimmed->start_ = iVar2;
  }
  else {
    lVar6 = 0;
    do {
      buffer_copy_space[lVar6] = pcVar5[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x30b);
    buffer_copy_space[0x30b] = '1';
    *(uint *)&trimmed->start_ = iVar2 + (uVar1 - iVar3);
    *(char **)CONCAT44(in_register_00000084,space_size) = buffer_copy_space;
    *(undefined4 *)(CONCAT44(in_register_00000084,space_size) + 8) = 0x30c;
  }
  return;
}

Assistant:

static Vector<const char> TrimLeadingZeros(Vector<const char> buffer) {
  for (int i = 0; i < buffer.length(); i++) {
    if (buffer[i] != '0') {
      return buffer.SubVector(i, buffer.length());
    }
  }
  return Vector<const char>(buffer.start(), 0);
}